

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O0

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long *in_RSI;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m128 two;
  __m128 one;
  __m128 one_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_2;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  int local_8e0;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  uint *local_888;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  long *local_858;
  undefined1 local_845;
  int local_844;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_820;
  uint *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  uint *local_7c0;
  long local_7b8;
  undefined4 local_7ac;
  long local_7a8;
  uint *local_7a0;
  undefined4 local_794;
  int local_790;
  int local_78c;
  undefined8 *local_788;
  undefined4 local_77c;
  long local_778;
  undefined8 *local_758;
  undefined4 local_728;
  undefined4 uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined4 local_70c;
  undefined4 local_708;
  undefined4 uStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  undefined4 local_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined1 local_6b8 [8];
  float fStack_6b0;
  float fStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  undefined4 local_668;
  undefined4 uStack_664;
  undefined4 uStack_660;
  undefined4 uStack_65c;
  undefined4 local_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_864 = *(int *)((long)in_RSI + 0x2c);
  local_868 = (int)in_RSI[6];
  local_86c = *(int *)((long)in_RSI + 0x34);
  local_870 = (int)in_RSI[7];
  local_874 = (int)in_RSI[3];
  local_878 = local_864 * local_868 * local_86c * local_874;
  local_858 = in_RSI;
  for (local_87c = 0; local_87c < local_870; local_87c = local_87c + 1) {
    local_838 = &local_8d0;
    local_78c = *(int *)((long)local_858 + 0x2c);
    local_790 = (int)local_858[6];
    local_794 = *(undefined4 *)((long)local_858 + 0x34);
    local_7a0 = (uint *)(*local_858 + local_858[8] * (long)local_87c * local_858[2]);
    local_7a8 = local_858[2];
    local_7ac = (undefined4)local_858[3];
    local_7b8 = local_858[4];
    local_788 = &local_8d0;
    local_778 = (long)local_78c * (long)local_790 * local_7a8;
    local_830 = &local_8d0;
    local_820 = &local_8d0;
    local_77c = 0x10;
    local_844 = local_87c;
    local_845 = 1;
    local_8d0 = 0;
    local_8c0 = 0;
    local_8b8 = 0;
    local_8a8 = 0;
    local_8a4 = 0;
    local_8a0 = 0;
    local_89c = 0;
    local_898 = 0;
    local_890 = 0;
    local_8c8 = 0;
    local_888 = local_7a0;
    for (local_8e0 = 0; local_758 = local_820, local_8b0 = local_7b8, local_8e0 + 3 < local_878;
        local_8e0 = local_8e0 + 4) {
      local_810 = local_888;
      local_7e8 = *(undefined8 *)local_888;
      uStack_7e0 = *(undefined8 *)(local_888 + 2);
      local_6ec = 0x3f800000;
      local_708 = 0x3f800000;
      local_7f8 = 0x3f8000003f800000;
      uStack_7f0 = 0x3f8000003f800000;
      local_70c = 0x40000000;
      local_728 = 0x40000000;
      local_808 = 0x4000000040000000;
      uStack_800 = 0x4000000040000000;
      local_698._0_4_ = (float)local_7e8;
      local_698._4_4_ = (float)((ulong)local_7e8 >> 0x20);
      uStack_690._0_4_ = (float)uStack_7e0;
      uStack_690._4_4_ = (float)((ulong)uStack_7e0 >> 0x20);
      local_678 = (float)local_698 * 2.0;
      fStack_674 = local_698._4_4_ * 2.0;
      fStack_670 = (float)uStack_690 * 2.0;
      fStack_66c = uStack_690._4_4_ * 2.0;
      local_64c = 0x3f800000;
      local_668 = 0x3f800000;
      local_688 = 0x3f8000003f800000;
      uStack_680 = 0x3f8000003f800000;
      local_498 = 0;
      uStack_490 = 0;
      local_638 = 0;
      uStack_630 = 0;
      local_648 = CONCAT44(fStack_674,local_678);
      uStack_640 = CONCAT44(fStack_66c,fStack_670);
      local_578 = CONCAT44(0.0 - fStack_674,0.0 - local_678);
      uStack_570._0_4_ = 0.0 - fStack_670;
      uStack_570._4_4_ = 0.0 - fStack_66c;
      local_4a8 = 0;
      uStack_4a0 = 0;
      local_5b8 = 0x3f8000003f800000;
      uStack_5b0 = 0x3f8000003f800000;
      local_478 = local_578;
      uStack_470 = uStack_570;
      local_488 = 0x42b0c0a542b0c0a5;
      uStack_480 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = uStack_570;
      auVar5._0_8_ = local_578;
      auVar4._8_8_ = 0x42b0c0a542b0c0a5;
      auVar4._0_8_ = 0x42b0c0a542b0c0a5;
      auVar9 = minps(auVar5,auVar4);
      local_578 = auVar9._0_8_;
      local_458 = local_578;
      uStack_570 = auVar9._8_8_;
      uStack_450 = uStack_570;
      local_468 = 0xc2b0c0a5c2b0c0a5;
      uStack_460 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9 = maxps(auVar9,auVar6);
      local_578 = auVar9._0_8_;
      uVar1 = local_578;
      uStack_570 = auVar9._8_8_;
      uVar2 = uStack_570;
      local_508 = 0x3fb8aa3b3fb8aa3b;
      uStack_500 = 0x3fb8aa3b3fb8aa3b;
      local_4f8._0_4_ = auVar9._0_4_;
      local_4f8._4_4_ = auVar9._4_4_;
      uStack_4f0._0_4_ = auVar9._8_4_;
      uStack_4f0._4_4_ = auVar9._12_4_;
      local_4b8 = CONCAT44(local_4f8._4_4_ * 1.442695,(float)local_4f8 * 1.442695);
      uStack_4b0 = CONCAT44(uStack_4f0._4_4_ * 1.442695,(float)uStack_4f0 * 1.442695);
      local_4c8 = 0x3f0000003f000000;
      uStack_4c0 = 0x3f0000003f000000;
      fVar10 = (float)local_4f8 * 1.442695 + 0.5;
      fVar11 = local_4f8._4_4_ * 1.442695 + 0.5;
      fVar12 = (float)uStack_4f0 * 1.442695 + 0.5;
      fVar13 = uStack_4f0._4_4_ * 1.442695 + 0.5;
      local_438 = CONCAT44(fVar11,fVar10);
      uStack_430 = CONCAT44(fVar13,fVar12);
      local_428 = CONCAT44((int)fVar11,(int)fVar10);
      uStack_420 = CONCAT44((int)fVar13,(int)fVar12);
      local_598 = (float)(int)fVar10;
      fStack_594 = (float)(int)fVar11;
      fStack_590 = (float)(int)fVar12;
      fStack_58c = (float)(int)fVar13;
      local_588 = CONCAT44(fStack_594,local_598);
      uStack_580 = CONCAT44(fStack_58c,fStack_590);
      local_408 = local_588;
      uStack_400 = uStack_580;
      local_418 = CONCAT44(fVar11,fVar10);
      uStack_410 = CONCAT44(fVar13,fVar12);
      local_5c8 = CONCAT44(-(uint)(fVar11 < fStack_594),-(uint)(fVar10 < local_598));
      uStack_5c0 = CONCAT44(-(uint)(fVar13 < fStack_58c),-(uint)(fVar12 < fStack_590));
      local_3e8 = local_5c8;
      uStack_3e0 = uStack_5c0;
      local_3f8 = 0x3f8000003f800000;
      uStack_3f0 = 0x3f8000003f800000;
      local_5c8 = local_5c8 & 0x3f8000003f800000;
      uStack_5c0 = uStack_5c0 & 0x3f8000003f800000;
      local_558 = local_588;
      uStack_550 = uStack_580;
      local_568._0_4_ = (float)local_5c8;
      local_568._4_4_ = (float)(local_5c8 >> 0x20);
      uStack_560._0_4_ = (float)uStack_5c0;
      uStack_560._4_4_ = (float)(uStack_5c0 >> 0x20);
      local_598 = local_598 - (float)local_568;
      fStack_594 = fStack_594 - local_568._4_4_;
      fStack_590 = fStack_590 - (float)uStack_560;
      fStack_58c = fStack_58c - uStack_560._4_4_;
      local_348 = CONCAT44(fStack_594,local_598);
      uStack_340 = CONCAT44(fStack_58c,fStack_590);
      local_368 = local_578;
      uStack_360 = uStack_570;
      local_358 = 0x3f3180003f318000;
      uStack_350 = 0x3f3180003f318000;
      local_328 = local_578;
      uStack_320 = uStack_570;
      local_318 = 0x3f3180003f318000;
      uStack_310 = 0x3f3180003f318000;
      local_338 = local_598 * 0.6933594;
      fStack_334 = fStack_594 * 0.6933594;
      fStack_330 = fStack_590 * 0.6933594;
      fStack_32c = fStack_58c * 0.6933594;
      local_578 = CONCAT44(local_4f8._4_4_ - fStack_334,(float)local_4f8 - local_338);
      uStack_570._0_4_ = (float)uStack_4f0 - fStack_330;
      uStack_570._4_4_ = uStack_4f0._4_4_ - fStack_32c;
      local_3b8 = CONCAT44(fStack_594,local_598);
      uStack_3b0 = CONCAT44(fStack_58c,fStack_590);
      local_3d8 = local_578;
      uStack_3d0 = uStack_570;
      local_3c8 = 0xb95e8083b95e8083;
      uStack_3c0 = 0xb95e8083b95e8083;
      local_398 = local_578;
      uStack_390 = uStack_570;
      local_388 = 0xb95e8083b95e8083;
      uStack_380 = 0xb95e8083b95e8083;
      local_3a8 = local_598 * -0.00021219444;
      fStack_3a4 = fStack_594 * -0.00021219444;
      fStack_3a0 = fStack_590 * -0.00021219444;
      fStack_39c = fStack_58c * -0.00021219444;
      fVar10 = ((float)local_4f8 - local_338) - local_3a8;
      fVar11 = (local_4f8._4_4_ - fStack_334) - fStack_3a4;
      fVar12 = ((float)uStack_4f0 - fStack_330) - fStack_3a0;
      fVar13 = (uStack_4f0._4_4_ - fStack_32c) - fStack_39c;
      local_578 = CONCAT44(fVar11,fVar10);
      uStack_570._0_4_ = fVar12;
      uStack_570._4_4_ = fVar13;
      local_528 = local_578;
      uStack_520 = uStack_570;
      local_588 = CONCAT44(fVar11 * fVar11,fVar10 * fVar10);
      uStack_580 = CONCAT44(fVar13 * fVar13,fVar12 * fVar12);
      local_a8 = 0x3950696739506967;
      uStack_a0 = 0x3950696739506967;
      local_b8 = local_578;
      uStack_b0 = uStack_570;
      local_c8 = 0x3ab743ce3ab743ce;
      uStack_c0 = 0x3ab743ce3ab743ce;
      local_88 = 0x3950696739506967;
      uStack_80 = 0x3950696739506967;
      local_98 = local_578;
      uStack_90 = uStack_570;
      local_68 = fVar10 * 0.00019875691;
      fStack_64 = fVar11 * 0.00019875691;
      fStack_60 = fVar12 * 0.00019875691;
      fStack_5c = fVar13 * 0.00019875691;
      local_78 = 0x3ab743ce3ab743ce;
      uStack_70 = 0x3ab743ce3ab743ce;
      local_5d8 = CONCAT44(fStack_64 + 0.0013981999,local_68 + 0.0013981999);
      uStack_5d0 = CONCAT44(fStack_5c + 0.0013981999,fStack_60 + 0.0013981999);
      local_118 = local_5d8;
      uStack_110 = uStack_5d0;
      local_128 = local_578;
      uStack_120 = uStack_570;
      local_138 = 0x3c0889083c088908;
      uStack_130 = 0x3c0889083c088908;
      local_f8 = local_5d8;
      uStack_f0 = uStack_5d0;
      local_108 = local_578;
      uStack_100 = uStack_570;
      local_d8 = (local_68 + 0.0013981999) * fVar10;
      fStack_d4 = (fStack_64 + 0.0013981999) * fVar11;
      fStack_d0 = (fStack_60 + 0.0013981999) * fVar12;
      fStack_cc = (fStack_5c + 0.0013981999) * fVar13;
      local_e8 = 0x3c0889083c088908;
      uStack_e0 = 0x3c0889083c088908;
      local_5d8 = CONCAT44(fStack_d4 + 0.008333452,local_d8 + 0.008333452);
      uStack_5d0 = CONCAT44(fStack_cc + 0.008333452,fStack_d0 + 0.008333452);
      local_188 = local_5d8;
      uStack_180 = uStack_5d0;
      local_198 = local_578;
      uStack_190 = uStack_570;
      local_1a8 = 0x3d2aa9c13d2aa9c1;
      uStack_1a0 = 0x3d2aa9c13d2aa9c1;
      local_168 = local_5d8;
      uStack_160 = uStack_5d0;
      local_178 = local_578;
      uStack_170 = uStack_570;
      local_148 = (local_d8 + 0.008333452) * fVar10;
      fStack_144 = (fStack_d4 + 0.008333452) * fVar11;
      fStack_140 = (fStack_d0 + 0.008333452) * fVar12;
      fStack_13c = (fStack_cc + 0.008333452) * fVar13;
      local_158 = 0x3d2aa9c13d2aa9c1;
      uStack_150 = 0x3d2aa9c13d2aa9c1;
      local_5d8 = CONCAT44(fStack_144 + 0.041665796,local_148 + 0.041665796);
      uStack_5d0 = CONCAT44(fStack_13c + 0.041665796,fStack_140 + 0.041665796);
      local_1f8 = local_5d8;
      uStack_1f0 = uStack_5d0;
      local_208 = local_578;
      uStack_200 = uStack_570;
      local_218 = 0x3e2aaaaa3e2aaaaa;
      uStack_210 = 0x3e2aaaaa3e2aaaaa;
      local_1d8 = local_5d8;
      uStack_1d0 = uStack_5d0;
      local_1e8 = local_578;
      uStack_1e0 = uStack_570;
      local_1b8 = (local_148 + 0.041665796) * fVar10;
      fStack_1b4 = (fStack_144 + 0.041665796) * fVar11;
      fStack_1b0 = (fStack_140 + 0.041665796) * fVar12;
      fStack_1ac = (fStack_13c + 0.041665796) * fVar13;
      local_1c8 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c0 = 0x3e2aaaaa3e2aaaaa;
      local_5d8 = CONCAT44(fStack_1b4 + 0.16666666,local_1b8 + 0.16666666);
      uStack_5d0 = CONCAT44(fStack_1ac + 0.16666666,fStack_1b0 + 0.16666666);
      local_268 = local_5d8;
      uStack_260 = uStack_5d0;
      local_278 = local_578;
      uStack_270 = uStack_570;
      local_248 = local_5d8;
      uStack_240 = uStack_5d0;
      local_258 = local_578;
      uStack_250 = uStack_570;
      local_228 = (local_1b8 + 0.16666666) * fVar10;
      fStack_224 = (fStack_1b4 + 0.16666666) * fVar11;
      fStack_220 = (fStack_1b0 + 0.16666666) * fVar12;
      fStack_21c = (fStack_1ac + 0.16666666) * fVar13;
      local_238 = 0x3f0000003f000000;
      uStack_230 = 0x3f0000003f000000;
      local_5d8 = CONCAT44(fStack_224 + 0.5,local_228 + 0.5);
      uStack_5d0 = CONCAT44(fStack_21c + 0.5,fStack_220 + 0.5);
      local_2d8 = local_5d8;
      uStack_2d0 = uStack_5d0;
      local_2e8 = local_588;
      uStack_2e0 = uStack_580;
      local_2f8 = local_578;
      uStack_2f0 = uStack_570;
      local_2b8 = local_5d8;
      uStack_2b0 = uStack_5d0;
      local_2c8 = local_588;
      uStack_2c0 = uStack_580;
      local_298 = (local_228 + 0.5) * fVar10 * fVar10;
      fStack_294 = (fStack_224 + 0.5) * fVar11 * fVar11;
      fStack_290 = (fStack_220 + 0.5) * fVar12 * fVar12;
      fStack_28c = (fStack_21c + 0.5) * fVar13 * fVar13;
      local_2a8 = local_578;
      uStack_2a0 = uStack_570;
      local_5d8 = CONCAT44(fStack_294 + fVar11,local_298 + fVar10);
      uStack_5d0 = CONCAT44(fStack_28c + fVar13,fStack_290 + fVar12);
      local_4d8 = local_5d8;
      uStack_4d0 = uStack_5d0;
      local_4e8 = 0x3f8000003f800000;
      uStack_4e0 = 0x3f8000003f800000;
      local_628 = local_298 + fVar10 + 1.0;
      fStack_624 = fStack_294 + fVar11 + 1.0;
      fStack_620 = fStack_290 + fVar12 + 1.0;
      fStack_61c = fStack_28c + fVar13 + 1.0;
      local_5d8 = CONCAT44(fStack_624,local_628);
      uStack_5d0 = CONCAT44(fStack_61c,fStack_620);
      local_448 = CONCAT44(fStack_594,local_598);
      uStack_440 = CONCAT44(fStack_58c,fStack_590);
      local_48 = CONCAT44((int)fStack_594,(int)local_598);
      uStack_40 = CONCAT44((int)fStack_58c,(int)fStack_590);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar7 = (int)local_598 + 0x7f;
      fStack_5a4 = (float)((int)fStack_594 + 0x7f);
      fStack_5a0 = (float)((int)fStack_590 + 0x7f);
      fStack_59c = (float)((int)fStack_58c + 0x7f);
      local_28 = CONCAT44(fStack_5a4,iVar7);
      uStack_20 = CONCAT44(fStack_59c,fStack_5a0);
      local_2c = 0x17;
      local_5a8 = (float)(iVar7 * 0x800000);
      local_5e8 = CONCAT44(fStack_5a4,local_5a8);
      uStack_5e0 = CONCAT44(fStack_59c,fStack_5a0);
      local_538 = local_5d8;
      uStack_530 = uStack_5d0;
      local_628 = local_628 * local_5a8;
      fStack_624 = fStack_624 * fStack_5a4;
      fStack_620 = fStack_620 * fStack_5a0;
      fStack_61c = fStack_61c * fStack_59c;
      local_5d8 = CONCAT44(fStack_624,local_628);
      uStack_5d0 = CONCAT44(fStack_61c,fStack_620);
      local_608 = local_5d8;
      uStack_600 = uStack_5d0;
      local_628 = local_628 + 1.0;
      fStack_624 = fStack_624 + 1.0;
      fStack_620 = fStack_620 + 1.0;
      fStack_61c = fStack_61c + 1.0;
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar9._4_4_ = fStack_624;
      auVar9._0_4_ = local_628;
      auVar9._8_4_ = fStack_620;
      auVar9._12_4_ = fStack_61c;
      _local_6b8 = divps(auVar3,auVar9);
      local_6d8 = (float)local_6b8._0_4_ * 2.0;
      fStack_6d4 = (float)local_6b8._4_4_ * 2.0;
      fStack_6d0 = fStack_6b0 * 2.0;
      fStack_6cc = fStack_6ac * 2.0;
      local_8f8 = CONCAT44(fStack_6d4 - 1.0,local_6d8 - 1.0);
      uStack_8f0 = CONCAT44(fStack_6cc - 1.0,fStack_6d0 - 1.0);
      local_7c0 = local_888;
      local_7d8 = local_8f8;
      uStack_7d0 = uStack_8f0;
      *(undefined8 *)local_888 = local_8f8;
      *(undefined8 *)(local_888 + 2) = uStack_8f0;
      local_888 = local_888 + 4;
      uStack_724 = local_728;
      uStack_720 = local_728;
      uStack_71c = local_728;
      uStack_704 = local_708;
      uStack_700 = local_708;
      uStack_6fc = local_708;
      local_6e8 = local_7f8;
      uStack_6e0 = uStack_7f0;
      local_6c8 = local_808;
      uStack_6c0 = uStack_800;
      local_6a8 = local_808;
      uStack_6a0 = uStack_800;
      local_698 = local_7e8;
      uStack_690 = uStack_7e0;
      uStack_664 = local_668;
      uStack_660 = local_668;
      uStack_65c = local_668;
      local_618 = local_688;
      uStack_610 = uStack_680;
      local_5f8 = local_688;
      uStack_5f0 = uStack_680;
      local_568 = local_5c8;
      uStack_560 = uStack_5c0;
      local_548 = local_5e8;
      uStack_540 = uStack_5e0;
      local_518 = local_528;
      uStack_510 = uStack_520;
      local_4f8 = uVar1;
      uStack_4f0 = uVar2;
      local_378 = local_3b8;
      uStack_370 = uStack_3b0;
      local_308 = local_348;
      uStack_300 = uStack_340;
      local_288 = local_4c8;
      uStack_280 = uStack_4c0;
      local_18 = local_5e8;
      uStack_10 = uStack_5e0;
    }
    for (; local_8e0 < local_878; local_8e0 = local_8e0 + 1) {
      dVar8 = std::tanh((double)(ulong)*local_888);
      *local_888 = SUB84(dVar8,0);
      local_888 = local_888 + 1;
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}